

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureLock.cc
# Opt level: O3

LockHandle * __thiscall SDL2pp::Texture::LockHandle::operator=(LockHandle *this,LockHandle *other)

{
  void *pvVar1;
  SDL_Texture *pSVar2;
  
  if (other != this) {
    if (this->texture_ != (Texture *)0x0) {
      pSVar2 = Get(this->texture_);
      SDL_UnlockTexture(pSVar2);
    }
    pvVar1 = other->pixels_;
    this->texture_ = other->texture_;
    this->pixels_ = pvVar1;
    this->pitch_ = other->pitch_;
    other->texture_ = (Texture *)0x0;
    other->pixels_ = (void *)0x0;
    other->pitch_ = 0;
  }
  return this;
}

Assistant:

Texture::LockHandle& Texture::LockHandle::operator=(Texture::LockHandle&& other) noexcept {
	if (&other == this)
		return *this;

	if (texture_ != nullptr)
		SDL_UnlockTexture(texture_->Get());

	texture_ = other.texture_;
	pixels_ = other.pixels_;
	pitch_ = other.pitch_;

	other.texture_ = nullptr;
	other.pixels_ = nullptr;
	other.pitch_ = 0;

	return *this;
}